

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O1

void multiply(features *f_dest,features *f_src2,interact *in)

{
  vw *pvVar1;
  ulong uVar2;
  ulong i;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong i_00;
  bool bVar6;
  uint64_t *puVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong local_68;
  
  features::clear(f_dest);
  pvVar1 = in->all;
  puVar7 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar7 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  uVar2 = *puVar7;
  i = *(in->feat_store).indicies._begin;
  uVar3 = *(f_src2->indicies)._begin;
  features::push_back(f_dest,*(in->feat_store).values._begin * *(f_src2->values)._begin,i);
  uVar11 = 1;
  local_68 = 0;
  uVar10 = 1;
  uVar13 = 0;
  do {
    pfVar4 = (in->feat_store).values._begin;
    if ((ulong)((long)(in->feat_store).values._end - (long)pfVar4 >> 2) <= uVar11) {
      return;
    }
    pfVar5 = (f_src2->values)._begin;
    if ((ulong)((long)(f_src2->values)._end - (long)pfVar5 >> 2) <= uVar10) {
      return;
    }
    i_00 = (in->feat_store).indicies._begin[uVar11];
    uVar9 = (i_00 & uVar2) - (i & uVar2) & uVar2;
    if (uVar9 < uVar13) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"interact features are out of order: ",0x24);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," < ",3);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,". Skipping features.",0x14);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
LAB_001ee0be:
      bVar6 = false;
      uVar9 = uVar13;
    }
    else {
      uVar12 = ((f_src2->indicies)._begin[uVar10] & uVar2) - (uVar3 & uVar2) & uVar2;
      if (uVar12 < local_68) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"interact features are out of order: ",0x24);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," < ",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,". Skipping features.",0x14);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_001ee0be;
      }
      if (uVar9 == uVar12) {
        features::push_back(f_dest,pfVar4[uVar11] * pfVar5[uVar10],i_00);
        uVar11 = uVar11 + 1;
LAB_001ee0f4:
        uVar10 = uVar10 + 1;
      }
      else {
        if (uVar12 <= uVar9) goto LAB_001ee0f4;
        uVar11 = uVar11 + 1;
      }
      bVar6 = true;
      local_68 = uVar12;
    }
    uVar13 = uVar9;
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void multiply(features& f_dest, features& f_src2, interact& in)
{
  f_dest.clear();
  features& f_src1 = in.feat_store;
  vw* all = in.all;
  uint64_t weight_mask = all->weights.mask();
  uint64_t base_id1 = f_src1.indicies[0] & weight_mask;
  uint64_t base_id2 = f_src2.indicies[0] & weight_mask;

  f_dest.push_back(f_src1.values[0] * f_src2.values[0], f_src1.indicies[0]);

  uint64_t prev_id1 = 0;
  uint64_t prev_id2 = 0;

  for (size_t i1 = 1, i2 = 1; i1 < f_src1.size() && i2 < f_src2.size();)
  {
    // calculating the relative offset from the namespace offset used to match features
    uint64_t cur_id1 = (uint64_t)(((f_src1.indicies[i1] & weight_mask) - base_id1) & weight_mask);
    uint64_t cur_id2 = (uint64_t)(((f_src2.indicies[i2] & weight_mask) - base_id2) & weight_mask);

    // checking for sorting requirement
    if (cur_id1 < prev_id1)
    {
      cout << "interact features are out of order: " << cur_id1 << " < " << prev_id1 << ". Skipping features." << endl;
      return;
    }

    if (cur_id2 < prev_id2)
    {
      cout << "interact features are out of order: " << cur_id2 << " < " << prev_id2 << ". Skipping features." << endl;
      return;
    }

    if (cur_id1 == cur_id2)
    {
      f_dest.push_back(f_src1.values[i1] * f_src2.values[i2], f_src1.indicies[i1]);
      i1++;
      i2++;
    }
    else if (cur_id1 < cur_id2)
      i1++;
    else
      i2++;
    prev_id1 = cur_id1;
    prev_id2 = cur_id2;
  }
}